

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O3

void __thiscall Rml::Element::DirtyStackingContext(Element *this)

{
  do {
    if (this->local_stacking_context != false) {
      this->stacking_context_dirty = true;
      return;
    }
    this = this->parent;
  } while (this != (Element *)0x0);
  return;
}

Assistant:

void Element::DirtyStackingContext()
{
	// Find the first ancestor that has a local stacking context, that is our stacking context parent.
	Element* stacking_context_parent = this;
	while (stacking_context_parent && !stacking_context_parent->local_stacking_context)
	{
		stacking_context_parent = stacking_context_parent->GetParentNode();
	}

	if (stacking_context_parent)
		stacking_context_parent->stacking_context_dirty = true;
}